

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::count_digits<4u,fmt::v7::detail::fallback_uintptr>(fallback_uintptr n)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  fallback_uintptr n_local;
  
  iVar1 = 0xe;
  uVar3 = 8;
  do {
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
    if (n_local.value[uVar3] != 0) {
      n.value[1] = '\0';
      n.value[2] = '\0';
      n.value[3] = '\0';
      n.value[4] = '\0';
      n.value[5] = '\0';
      n.value[6] = '\0';
      n.value[7] = '\0';
      n.value[0] = n_local.value[uVar3];
      goto LAB_004c4b87;
    }
    iVar1 = iVar1 + -2;
  } while (1 < uVar2);
  iVar1 = 0;
LAB_004c4b87:
  uVar3 = (ulong)n.value & 0xff;
  do {
    iVar1 = iVar1 + 1;
    uVar2 = (uint)uVar3;
    uVar3 = uVar3 >> 4;
  } while (0xf < uVar2);
  return iVar1;
}

Assistant:

FMT_FUNC int count_digits<4>(detail::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}